

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPartialsPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,int startPattern,int endPattern)

{
  double *pdVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  
  lVar16 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < lVar16) {
    iVar4 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    iVar17 = startPattern * 4;
    lVar19 = 0;
    auVar6 = vpmovsxbq_avx(ZEXT216(0xa05));
    auVar7 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
    auVar8 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
    do {
      if (startPattern < endPattern) {
        lVar20 = (long)iVar17 << 3;
        auVar21 = vpbroadcastq_avx512vl();
        auVar5 = vpaddq_avx(auVar21._0_16_,auVar6);
        lVar2 = lVar19 * 0x14 + 0xf;
        auVar23 = vpermq_avx2(ZEXT1632(auVar5),0xd0);
        auVar23 = vpblendd_avx2(auVar23,auVar21,3);
        auVar22 = vpbroadcastq_avx512vl();
        vpblendd_avx2(auVar23,auVar22,0xc0);
        auVar23 = vgatherqpd_avx512vl(matrices1[(long)matrices2]);
        vpaddq_avx2(auVar21,auVar7);
        auVar22 = vgatherqpd_avx512vl(matrices1[(uint)endPattern]);
        vpaddq_avx2(auVar21,auVar8);
        auVar24 = vgatherqpd_avx512vl(matrices1[(uint)startPattern]);
        vpaddq_avx2(auVar21,auVar9);
        auVar21 = vgatherqpd_avx512vl(matrices1[lVar2]);
        auVar25 = vgatherqpd_avx512vl(*(undefined8 *)((long)matrices2 * 9));
        auVar26 = vgatherqpd_avx512vl(matrices2[(uint)endPattern]);
        auVar27 = vgatherqpd_avx512vl(matrices2[(uint)startPattern]);
        auVar28 = vgatherqpd_avx512vl(matrices2[lVar2]);
        iVar18 = endPattern - startPattern;
        do {
          uVar3 = *(undefined8 *)((long)partials1 + lVar20 + 8);
          auVar29._8_8_ = uVar3;
          auVar29._0_8_ = uVar3;
          auVar29._16_8_ = uVar3;
          auVar29._24_8_ = uVar3;
          auVar29 = vmulpd_avx512vl(auVar22,auVar29);
          uVar3 = *(undefined8 *)((long)partials1 + lVar20);
          auVar30._8_8_ = uVar3;
          auVar30._0_8_ = uVar3;
          auVar30._16_8_ = uVar3;
          auVar30._24_8_ = uVar3;
          auVar29 = vfmadd231pd_avx512vl(auVar29,auVar23,auVar30);
          uVar3 = *(undefined8 *)((long)partials1 + lVar20 + 0x10);
          auVar10._8_8_ = uVar3;
          auVar10._0_8_ = uVar3;
          auVar10._16_8_ = uVar3;
          auVar10._24_8_ = uVar3;
          auVar29 = vfmadd231pd_avx512vl(auVar29,auVar24,auVar10);
          uVar3 = *(undefined8 *)((long)partials1 + lVar20 + 0x18);
          auVar11._8_8_ = uVar3;
          auVar11._0_8_ = uVar3;
          auVar11._16_8_ = uVar3;
          auVar11._24_8_ = uVar3;
          auVar29 = vfmadd231pd_avx512vl(auVar29,auVar21,auVar11);
          uVar3 = *(undefined8 *)((long)partials2 + lVar20 + 8);
          auVar12._8_8_ = uVar3;
          auVar12._0_8_ = uVar3;
          auVar12._16_8_ = uVar3;
          auVar12._24_8_ = uVar3;
          auVar30 = vmulpd_avx512vl(auVar26,auVar12);
          uVar3 = *(undefined8 *)((long)partials2 + lVar20);
          auVar13._8_8_ = uVar3;
          auVar13._0_8_ = uVar3;
          auVar13._16_8_ = uVar3;
          auVar13._24_8_ = uVar3;
          auVar30 = vfmadd231pd_avx512vl(auVar30,auVar25,auVar13);
          uVar3 = *(undefined8 *)((long)partials2 + lVar20 + 0x10);
          auVar14._8_8_ = uVar3;
          auVar14._0_8_ = uVar3;
          auVar14._16_8_ = uVar3;
          auVar14._24_8_ = uVar3;
          auVar30 = vfmadd231pd_avx512vl(auVar30,auVar27,auVar14);
          uVar3 = *(undefined8 *)((long)partials2 + lVar20 + 0x18);
          auVar15._8_8_ = uVar3;
          auVar15._0_8_ = uVar3;
          auVar15._16_8_ = uVar3;
          auVar15._24_8_ = uVar3;
          auVar30 = vfmadd231pd_avx512vl(auVar30,auVar28,auVar15);
          pdVar1 = (double *)((long)destP + lVar20);
          *pdVar1 = auVar29._0_8_ * auVar30._0_8_;
          pdVar1[1] = auVar29._8_8_ * auVar30._8_8_;
          pdVar1[2] = auVar29._16_8_ * auVar30._16_8_;
          pdVar1[3] = auVar29._24_8_ * auVar30._24_8_;
          lVar20 = lVar20 + 0x20;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      lVar19 = lVar19 + 1;
      iVar17 = iVar17 + iVar4 * 4;
    } while (lVar19 != lVar16);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                                   const REALTYPE* partials1,
                                                                   const REALTYPE* matrices1,
                                                                   const REALTYPE* partials2,
                                                                   const REALTYPE* matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            u += 4;

        }
    }
}